

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

void __thiscall entityx::EntityManager::remove<Direction>(EntityManager *this,Id id)

{
  char *pcVar1;
  reference ppBVar2;
  vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *this_00;
  int __c;
  int __c_00;
  Id in_RSI;
  Entity *__s;
  EntityManager *in_RDI;
  ComponentHandle<Direction,_entityx::EntityManager> *in_stack_00000010;
  Entity *in_stack_00000018;
  EventManager *in_stack_00000020;
  ComponentHandle<Direction,_entityx::EntityManager> component;
  BasePool *pool;
  uint32_t index;
  Family family;
  size_t __position;
  Entity local_58;
  uint64_t local_48;
  ComponentHandle<Direction,_entityx::EntityManager> local_40;
  value_type local_30;
  undefined4 local_24;
  size_type local_20;
  Id local_8;
  
  local_8.id_ = in_RSI.id_;
  assert_valid(in_RDI,in_RSI);
  local_20 = component_family<Direction>();
  pcVar1 = Entity::Id::index(&local_8,(char *)in_RSI.id_,__c);
  local_24 = SUB84(pcVar1,0);
  ppBVar2 = Catch::clara::std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::
            operator[]((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)
                       (in_RDI + 0x18),local_20);
  local_30 = *ppBVar2;
  local_48 = local_8.id_;
  ComponentHandle<Direction,_entityx::EntityManager>::ComponentHandle(&local_40,in_RDI,local_8);
  __position = *(size_t *)(in_RDI + 0x10);
  Entity::Entity(&local_58,in_RDI,local_8);
  __s = &local_58;
  EventManager::
  emit<entityx::ComponentRemovedEvent<Direction>,entityx::Entity,entityx::ComponentHandle<Direction,entityx::EntityManager>&>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  this_00 = (vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *)(in_RDI + 0x48);
  pcVar1 = Entity::Id::index(&local_8,(char *)__s,__c_00);
  Catch::clara::std::vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>::operator[]
            (this_00,(ulong)pcVar1 & 0xffffffff);
  Catch::clara::std::bitset<64UL>::reset((bitset<64UL> *)in_RDI,__position);
  (**(code **)(*(long *)local_30 + 0x10))(local_30,local_24);
  return;
}

Assistant:

void remove(Entity::Id id) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    const uint32_t index = id.index();

    // Find the pool for this component family.
    BasePool *pool = component_pools_[family];
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentRemovedEvent<C>>(Entity(this, id), component);

    // Remove component bit.
    entity_component_mask_[id.index()].reset(family);

    // Call destructor.
    pool->destroy(index);
  }